

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.h
# Opt level: O3

void __thiscall wabt::Features::EnableAll(Features *this)

{
  this->exceptions_enabled_ = true;
  UpdateDependencies(this);
  this->mutable_globals_enabled_ = true;
  UpdateDependencies(this);
  this->sat_float_to_int_enabled_ = true;
  UpdateDependencies(this);
  this->sign_extension_enabled_ = true;
  UpdateDependencies(this);
  this->simd_enabled_ = true;
  UpdateDependencies(this);
  this->threads_enabled_ = true;
  UpdateDependencies(this);
  this->function_references_enabled_ = true;
  UpdateDependencies(this);
  this->multi_value_enabled_ = true;
  UpdateDependencies(this);
  this->tail_call_enabled_ = true;
  UpdateDependencies(this);
  this->bulk_memory_enabled_ = true;
  UpdateDependencies(this);
  this->reference_types_enabled_ = true;
  UpdateDependencies(this);
  this->annotations_enabled_ = true;
  UpdateDependencies(this);
  this->code_metadata_enabled_ = true;
  UpdateDependencies(this);
  this->gc_enabled_ = true;
  UpdateDependencies(this);
  this->memory64_enabled_ = true;
  UpdateDependencies(this);
  this->multi_memory_enabled_ = true;
  UpdateDependencies(this);
  this->extended_const_enabled_ = true;
  UpdateDependencies(this);
  this->relaxed_simd_enabled_ = true;
  UpdateDependencies(this);
  this->custom_page_sizes_enabled_ = true;
  UpdateDependencies(this);
  return;
}

Assistant:

void EnableAll() {
#define WABT_FEATURE(variable, flag, default_, help) enable_##variable();
#include "wabt/feature.def"
#undef WABT_FEATURE
  }